

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_send_message(Curl_easy *data,uchar cmd,void *msg,size_t msg_len)

{
  connectdata *pcVar1;
  CURLcode CVar2;
  smb_conn *smbc;
  connectdata *conn;
  size_t msg_len_local;
  void *msg_local;
  uchar cmd_local;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  smb_format_message(data,(smb_header *)(pcVar1->proto).smbc.send_buf,cmd,msg_len);
  memcpy((void *)((pcVar1->proto).ftpc.pp.response_time + 0x24),msg,msg_len);
  CVar2 = smb_send(data,msg_len + 0x24,0);
  return CVar2;
}

Assistant:

static CURLcode smb_send_message(struct Curl_easy *data, unsigned char cmd,
                                 const void *msg, size_t msg_len)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;

  smb_format_message(data, (struct smb_header *)smbc->send_buf,
                     cmd, msg_len);
  DEBUGASSERT((sizeof(struct smb_header) + msg_len) <= MAX_MESSAGE_SIZE);
  memcpy(smbc->send_buf + sizeof(struct smb_header), msg, msg_len);

  return smb_send(data, sizeof(struct smb_header) + msg_len, 0);
}